

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineState.h
# Opt level: O0

bool Diligent::PipelineResourceLayoutDesc::IsEqual
               (PipelineResourceLayoutDesc *Desc1,PipelineResourceLayoutDesc *Desc2,
               bool IgnoreVariables,bool IgnoreSamplers)

{
  bool bVar1;
  uint local_2c;
  uint local_28;
  Uint32 i_1;
  Uint32 i;
  bool IgnoreSamplers_local;
  bool IgnoreVariables_local;
  PipelineResourceLayoutDesc *Desc2_local;
  PipelineResourceLayoutDesc *Desc1_local;
  
  if ((((Desc1->DefaultVariableType == Desc2->DefaultVariableType) &&
       (Desc1->DefaultVariableMergeStages == Desc2->DefaultVariableMergeStages)) &&
      (Desc1->NumVariables == Desc2->NumVariables)) &&
     (Desc1->NumImmutableSamplers == Desc2->NumImmutableSamplers)) {
    if (!IgnoreVariables) {
      for (local_28 = 0; local_28 < Desc1->NumVariables; local_28 = local_28 + 1) {
        bVar1 = ShaderResourceVariableDesc::operator!=
                          (Desc1->Variables + local_28,Desc2->Variables + local_28);
        if (bVar1) {
          return false;
        }
      }
    }
    if (!IgnoreSamplers) {
      for (local_2c = 0; local_2c < Desc1->NumImmutableSamplers; local_2c = local_2c + 1) {
        bVar1 = ImmutableSamplerDesc::operator!=
                          (Desc1->ImmutableSamplers + local_2c,Desc2->ImmutableSamplers + local_2c);
        if (bVar1) {
          return false;
        }
      }
    }
    Desc1_local._7_1_ = true;
  }
  else {
    Desc1_local._7_1_ = false;
  }
  return Desc1_local._7_1_;
}

Assistant:

static bool IsEqual(const PipelineResourceLayoutDesc& Desc1,
                        const PipelineResourceLayoutDesc& Desc2,
                        bool                              IgnoreVariables = false,
                        bool                              IgnoreSamplers  = false)
    {
        if (!(Desc1.DefaultVariableType        == Desc2.DefaultVariableType        &&
              Desc1.DefaultVariableMergeStages == Desc2.DefaultVariableMergeStages &&
              Desc1.NumVariables               == Desc2.NumVariables               &&
              Desc1.NumImmutableSamplers       == Desc2.NumImmutableSamplers))
           return false;

        if (!IgnoreVariables)
        {
            for (Uint32 i = 0; i < Desc1.NumVariables; ++i)
                if (Desc1.Variables[i] != Desc2.Variables[i])
                    return false;
        }

        if (!IgnoreSamplers)
        {
            for (Uint32 i = 0; i < Desc1.NumImmutableSamplers; ++i)
                if (Desc1.ImmutableSamplers[i] != Desc2.ImmutableSamplers[i])
                    return false;
        }

        return true;
    }